

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O2

int ClipSegmentToLine(ClipVertex *vOut,ClipVertex *vIn,btVector3 *normal,btScalar offset)

{
  ClipVertex *v;
  bool bVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  btScalar bVar7;
  float fVar8;
  float fVar9;
  btVector3 bVar10;
  btVector3 local_38;
  
  bVar7 = btVector3::dot(normal,&vIn->v);
  fVar8 = bVar7 - offset;
  v = vIn + 1;
  bVar7 = btVector3::dot(normal,&v->v);
  fVar9 = bVar7 - offset;
  bVar1 = fVar8 <= 0.0;
  if (bVar1) {
    vOut->id = vIn->id;
    uVar2 = *(undefined8 *)((vIn->v).m_floats + 2);
    *(undefined8 *)(vOut->v).m_floats = *(undefined8 *)(vIn->v).m_floats;
    *(undefined8 *)((vOut->v).m_floats + 2) = uVar2;
  }
  uVar4 = (ulong)bVar1;
  uVar5 = uVar4;
  if (fVar9 <= 0.0) {
    uVar5 = (ulong)(bVar1 + 1);
    vOut[uVar4].id = vIn[1].id;
    uVar2 = *(undefined8 *)(vIn[1].v.m_floats + 2);
    *(undefined8 *)vOut[uVar4].v.m_floats = *(undefined8 *)(v->v).m_floats;
    *(undefined8 *)(vOut[uVar4].v.m_floats + 2) = uVar2;
  }
  iVar3 = (int)uVar5;
  if (fVar8 * fVar9 < 0.0) {
    fVar9 = fVar8 / (fVar8 - fVar9);
    bVar10 = operator-(&v->v,&vIn->v);
    local_38.m_floats[1] = fVar9 * bVar10.m_floats[1];
    local_38.m_floats[0] = fVar9 * bVar10.m_floats[0];
    local_38.m_floats[2] = bVar10.m_floats[2] * fVar9;
    local_38.m_floats[3] = 0.0;
    bVar10 = operator+(&vIn->v,&local_38);
    piVar6 = &vIn->id;
    if (fVar8 <= 0.0) {
      piVar6 = &vIn[1].id;
    }
    *&vOut[uVar5].v.m_floats = bVar10.m_floats;
    vOut[uVar5].id = *piVar6;
    iVar3 = iVar3 + 1;
  }
  return iVar3;
}

Assistant:

static int ClipSegmentToLine(ClipVertex vOut[2], ClipVertex vIn[2],
					  const btVector3& normal, btScalar offset)
{
	// Start with no output points
	int numOut = 0;

	// Calculate the distance of end points to the line
	btScalar distance0 = b2Dot(normal, vIn[0].v) - offset;
	btScalar distance1 = b2Dot(normal, vIn[1].v) - offset;

	// If the points are behind the plane
	if (distance0 <= 0.0f) vOut[numOut++] = vIn[0];
	if (distance1 <= 0.0f) vOut[numOut++] = vIn[1];

	// If the points are on different sides of the plane
	if (distance0 * distance1 < 0.0f)
	{
		// Find intersection point of edge and plane
		btScalar interp = distance0 / (distance0 - distance1);
		vOut[numOut].v = vIn[0].v + interp * (vIn[1].v - vIn[0].v);
		if (distance0 > 0.0f)
		{
			vOut[numOut].id = vIn[0].id;
		}
		else
		{
			vOut[numOut].id = vIn[1].id;
		}
		++numOut;
	}

	return numOut;
}